

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_zip64.c
# Opt level: O3

void test_write_format_zip_zip64_oversize(void)

{
  verify_zip_filesize(0xffffffff,0);
  verify_zip_filesize(0x100000000,-0x19);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_zip64_oversize)
{
	/* With Zip64 extensions disabled, we should be
	 * able to write a file with at most 4G-1 bytes. */

	/* Note:  Tar writer pads file to declared size when the file
	 * is closed.  If Zip writer is changed to behave the same
	 * way, it will be much harder to test the first case here. */
	verify_zip_filesize(0xffffffffLL, ARCHIVE_OK);

	verify_zip_filesize(0x100000000LL, ARCHIVE_FAILED);
}